

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc stbi__get8(stbi__context *s)

{
  stbi_uc *psVar1;
  stbi__context *in_RDI;
  stbi_uc local_1;
  
  if (in_RDI->img_buffer < in_RDI->img_buffer_end) {
    psVar1 = in_RDI->img_buffer;
    in_RDI->img_buffer = psVar1 + 1;
    local_1 = *psVar1;
  }
  else if (in_RDI->read_from_callbacks == 0) {
    local_1 = '\0';
  }
  else {
    stbi__refill_buffer(in_RDI);
    psVar1 = in_RDI->img_buffer;
    in_RDI->img_buffer = psVar1 + 1;
    local_1 = *psVar1;
  }
  return local_1;
}

Assistant:

stbi_inline static stbi_uc stbi__get8(stbi__context *s)
{
   if (s->img_buffer < s->img_buffer_end)
      return *s->img_buffer++;
   if (s->read_from_callbacks) {
      stbi__refill_buffer(s);
      return *s->img_buffer++;
   }
   return 0;
}